

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateProgramOutputTypeBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask)

{
  NodeType NVar1;
  Context *pCVar2;
  ShaderType SVar3;
  TestNode *pTVar4;
  Node *pNVar5;
  SharedPtrStateBase *pSVar6;
  Node *pNVar7;
  int iVar8;
  deInt32 *pdVar9;
  SharedPtr arrayElem;
  SharedPtr arrayElement;
  SharedPtr output;
  SharedPtr local_78;
  SharedPtr local_68;
  Context *local_50;
  SharedPtr local_48;
  TestNode *local_38;
  
  pNVar5 = parentStructure->m_ptr;
  NVar1 = pNVar5->m_type;
  local_38 = &targetGroup->super_TestNode;
  if (NVar1 == TYPE_DEFAULT_BLOCK) {
    pNVar7 = (Node *)operator_new(0x28);
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar7->m_type = TYPE_STORAGE_QUALIFIER;
    (pNVar7->m_enclosingNode).m_ptr = pNVar5;
    pSVar6 = parentStructure->m_state;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_021b1fc8;
    *(undefined4 *)&pNVar7[1]._vptr_Node = 1;
    local_48.m_state = (SharedPtrStateBase *)0x0;
    local_48.m_ptr = pNVar7;
    local_48.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_48.m_state)->strongRefCount = 0;
    (local_48.m_state)->weakRefCount = 0;
    (local_48.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    local_48.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    (local_48.m_state)->strongRefCount = 1;
    (local_48.m_state)->weakRefCount = 1;
  }
  else {
    local_48.m_state = parentStructure->m_state;
    local_48.m_ptr = pNVar5;
    if (local_48.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_48.m_state)->strongRefCount = (local_48.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_48.m_state)->weakRefCount = (local_48.m_state)->weakRefCount + 1;
      UNLOCK();
    }
  }
  SVar3 = getShaderMaskLastStage(presentShadersMask);
  local_50 = context;
  if (((NVar1 == TYPE_DEFAULT_BLOCK) && (SVar3 != SHADERTYPE_TESSELLATION_EVALUATION)) &&
     ((SVar3 & ~SHADERTYPE_GEOMETRY) != SHADERTYPE_VERTEX)) {
    if (SVar3 == SHADERTYPE_TESSELLATION_CONTROL) {
      pNVar5 = (Node *)operator_new(0x28);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar5->m_type = TYPE_STORAGE_QUALIFIER;
      (pNVar5->m_enclosingNode).m_ptr = parentStructure->m_ptr;
      pSVar6 = parentStructure->m_state;
      (pNVar5->m_enclosingNode).m_state = pSVar6;
      if (pSVar6 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar9 = *pdVar9 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1fc8;
      *(undefined4 *)&pNVar5[1]._vptr_Node = 6;
      local_68.m_state = (SharedPtrStateBase *)0x0;
      local_68.m_ptr = pNVar5;
      local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_68.m_state)->strongRefCount = 0;
      (local_68.m_state)->weakRefCount = 0;
      (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      (local_68.m_state)->strongRefCount = 1;
      (local_68.m_state)->weakRefCount = 1;
      pNVar5 = (Node *)operator_new(0x28);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar5->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar5->m_enclosingNode).m_ptr = local_48.m_ptr;
      (pNVar5->m_enclosingNode).m_state = local_48.m_state;
      if (local_48.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_48.m_state)->strongRefCount = (local_48.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar9 = *pdVar9 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
      *(undefined4 *)&pNVar5[1]._vptr_Node = 0xfffffffe;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar5;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      local_78.m_state = pSVar6;
      pTVar4 = (TestNode *)operator_new(0x78);
      pCVar2 = local_50;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar4,local_50->m_testCtx,"basic_type","Basic types");
      pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
      pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
      tcu::TestNode::addChild(local_38,pTVar4);
      generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
                (local_50,&local_78,(TestCaseGroup *)pTVar4,true,2);
      pdVar9 = &pSVar6->strongRefCount;
      LOCK();
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar9 = &(local_78.m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_78.m_state = (SharedPtrStateBase *)0x0;
      }
      pTVar4 = (TestNode *)operator_new(0x78);
      pCVar2 = local_50;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar4,local_50->m_testCtx,"patch_var","Basic types, per-patch");
      pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
      pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
      tcu::TestNode::addChild(local_38,pTVar4);
      generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
                (local_50,&local_68,(TestCaseGroup *)pTVar4,true,1);
      pNVar5 = (Node *)operator_new(0x20);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar5->m_type = TYPE_STRUCT_MEMBER;
      (pNVar5->m_enclosingNode).m_ptr = local_68.m_ptr;
      (pNVar5->m_enclosingNode).m_state = local_68.m_state;
      if (local_68.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_68.m_state)->strongRefCount = (local_68.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar9 = *pdVar9 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b20f8;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar5;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      local_78.m_state = pSVar6;
      pTVar4 = (TestNode *)operator_new(0x78);
      pCVar2 = local_50;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar4,local_50->m_testCtx,"patch_var_struct",
                 "Struct types, per-patch");
      pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
      pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
      tcu::TestNode::addChild(local_38,pTVar4);
      generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
                (local_50,&local_78,(TestCaseGroup *)pTVar4,true,1);
      pdVar9 = &pSVar6->strongRefCount;
      LOCK();
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar9 = &(local_78.m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_78.m_state = (SharedPtrStateBase *)0x0;
      }
      pNVar5 = (Node *)operator_new(0x28);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar5->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar5->m_enclosingNode).m_ptr = local_68.m_ptr;
      (pNVar5->m_enclosingNode).m_state = local_68.m_state;
      if (local_68.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_68.m_state)->strongRefCount = (local_68.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar9 = *pdVar9 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
      *(undefined4 *)&pNVar5[1]._vptr_Node = 0xffffffff;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar5;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pCVar2 = local_50;
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      local_78.m_state = pSVar6;
      pTVar4 = (TestNode *)operator_new(0x78);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar4,pCVar2->m_testCtx,"patch_var_array",
                 "Array types, per-patch");
      pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
      pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
      tcu::TestNode::addChild(local_38,pTVar4);
      generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
                (pCVar2,&local_78,(TestCaseGroup *)pTVar4,true,1);
      goto LAB_015ab73a;
    }
    if (SVar3 != SHADERTYPE_FRAGMENT) goto LAB_015ab7c3;
    pTVar4 = (TestNode *)operator_new(0x78);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,context->m_testCtx,"basic_type","Basic types");
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
    pTVar4[1]._vptr_TestNode = (_func_int **)context;
    tcu::TestNode::addChild(local_38,pTVar4);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (context,&local_48,(TestCaseGroup *)pTVar4,false,2);
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar5->m_enclosingNode).m_ptr = local_48.m_ptr;
    (pNVar5->m_enclosingNode).m_state = local_48.m_state;
    if (local_48.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_48.m_state)->strongRefCount = (local_48.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 0xffffffff;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_68.m_state = pSVar6;
    pTVar4 = (TestNode *)operator_new(0x78);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,context->m_testCtx,"array","Array types");
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
    pTVar4[1]._vptr_TestNode = (_func_int **)context;
    tcu::TestNode::addChild(local_38,pTVar4);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (context,&local_68,(TestCaseGroup *)pTVar4,false,2);
    pdVar9 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    iVar8 = *pdVar9;
    UNLOCK();
  }
  else {
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_INTERPOLATION_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = local_48.m_ptr;
    (pNVar5->m_enclosingNode).m_state = local_48.m_state;
    if (local_48.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_48.m_state)->strongRefCount = (local_48.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2920;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 1;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_68.m_state = pSVar6;
    pTVar4 = (TestNode *)operator_new(0x78);
    pCVar2 = local_50;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,local_50->m_testCtx,"basic_type","Basic types");
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    tcu::TestNode::addChild(local_38,pTVar4);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (local_50,&local_68,(TestCaseGroup *)pTVar4,true,(NVar1 == TYPE_DEFAULT_BLOCK) + 1);
    pNVar7 = (Node *)operator_new(0x28);
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar7->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar7->m_enclosingNode).m_ptr = pNVar5;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
    *(undefined4 *)&pNVar7[1]._vptr_Node = 0xffffffff;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar7;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_78.m_state = pSVar6;
    pTVar4 = (TestNode *)operator_new(0x78);
    pCVar2 = local_50;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,local_50->m_testCtx,"array","Array types");
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    iVar8 = (uint)(NVar1 == TYPE_DEFAULT_BLOCK) + (uint)(SVar3 == SHADERTYPE_VERTEX);
    tcu::TestNode::addChild(local_38,pTVar4);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (pCVar2,&local_78,(TestCaseGroup *)pTVar4,true,iVar8);
    pdVar9 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar9 = &(local_78.m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_78.m_state = (SharedPtrStateBase *)0x0;
    }
    pNVar5 = (Node *)operator_new(0x20);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_STRUCT_MEMBER;
    (pNVar5->m_enclosingNode).m_ptr = local_68.m_ptr;
    (pNVar5->m_enclosingNode).m_state = local_68.m_state;
    if (local_68.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_68.m_state)->strongRefCount = (local_68.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b20f8;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_78.m_state = pSVar6;
    pTVar4 = (TestNode *)operator_new(0x78);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,pCVar2->m_testCtx,"struct","Struct types");
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    tcu::TestNode::addChild(local_38,pTVar4);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (pCVar2,&local_78,(TestCaseGroup *)pTVar4,true,iVar8);
LAB_015ab73a:
    pdVar9 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar9 = &(local_78.m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_78.m_state = (SharedPtrStateBase *)0x0;
    }
    if (local_68.m_state == (SharedPtrStateBase *)0x0) goto LAB_015ab7c3;
    LOCK();
    pdVar9 = &(local_68.m_state)->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    iVar8 = *pdVar9;
    UNLOCK();
  }
  if (iVar8 == 0) {
    local_68.m_ptr = (Node *)0x0;
    (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar9 = &(local_68.m_state)->weakRefCount;
  *pdVar9 = *pdVar9 + -1;
  UNLOCK();
  if (*pdVar9 == 0) {
    if (local_68.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_68.m_state = (SharedPtrStateBase *)0x0;
  }
LAB_015ab7c3:
  if (local_48.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar9 = &(local_48.m_state)->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_48.m_ptr = (Node *)0x0;
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar9 = &(local_48.m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_48.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateProgramOutputTypeBlockContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, deUint32 presentShadersMask)
{
	const bool									inDefaultBlock						= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	output								= (inDefaultBlock)
																						? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_OUT)))
																						: (parentStructure);
	const glu::ShaderType						lastStage							= getShaderMaskLastStage(presentShadersMask);
	const int									interfaceBlockExpansionReducement	= (!inDefaultBlock) ? (1) : (0); // lesser expansions on block members to keep test counts reasonable

	if (lastStage == glu::SHADERTYPE_VERTEX						||
		lastStage == glu::SHADERTYPE_GEOMETRY					||
		lastStage == glu::SHADERTYPE_TESSELLATION_EVALUATION	||
		!inDefaultBlock)
	{
		const ResourceDefinition::Node::SharedPtr flatShading(new ResourceDefinition::InterpolationQualifier(output, glu::INTERPOLATION_FLAT));

		// Only basic types, arrays of basic types, struct of basic types (and no booleans)
		{
			tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "basic_type", "Basic types");
			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, flatShading, blockGroup, true, 2 - interfaceBlockExpansionReducement);
		}
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement			(new ResourceDefinition::ArrayElement(flatShading));
			tcu::TestCaseGroup* const					blockGroup				= new TestCaseGroup(context, "array", "Array types");
			const int									typeExpansionReducement	= (lastStage != glu::SHADERTYPE_VERTEX) ? (1) : (0); // lesser expansions on other stages
			const int									expansionLevel			= 2 - interfaceBlockExpansionReducement - typeExpansionReducement;

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, arrayElement, blockGroup, true, expansionLevel);
		}
		{
			const ResourceDefinition::Node::SharedPtr	structMember			(new ResourceDefinition::StructMember(flatShading));
			tcu::TestCaseGroup* const					blockGroup				= new TestCaseGroup(context, "struct", "Struct types");
			const int									typeExpansionReducement	= (lastStage != glu::SHADERTYPE_VERTEX) ? (1) : (0); // lesser expansions on other stages
			const int									expansionLevel			= 2 - interfaceBlockExpansionReducement - typeExpansionReducement;

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, structMember, blockGroup, true, expansionLevel);
		}
	}
	else if (lastStage == glu::SHADERTYPE_FRAGMENT)
	{
		// only basic type and basic type array (and no booleans or matrices)
		{
			tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "basic_type", "Basic types");
			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, output, blockGroup, false, 2);
		}
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(output));
			tcu::TestCaseGroup* const					blockGroup		= new TestCaseGroup(context, "array", "Array types");

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, arrayElement, blockGroup, false, 2);
		}
	}
	else if (lastStage == glu::SHADERTYPE_TESSELLATION_CONTROL)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchOutput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_OUT));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr	arrayElem		(new ResourceDefinition::ArrayElement(output, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			tcu::TestCaseGroup* const					blockGroup		= new TestCaseGroup(context, "basic_type", "Basic types");

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, arrayElem, blockGroup, true, 2);
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays

		// .patch_var
		{
			tcu::TestCaseGroup* const					blockGroup		= new TestCaseGroup(context, "patch_var", "Basic types, per-patch");

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, patchOutput, blockGroup, true, 1);
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr	structMbr		(new ResourceDefinition::StructMember(patchOutput));
			tcu::TestCaseGroup* const					blockGroup		= new TestCaseGroup(context, "patch_var_struct", "Struct types, per-patch");

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, structMbr, blockGroup, true, 1);
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr	arrayElem		(new ResourceDefinition::ArrayElement(patchOutput));
			tcu::TestCaseGroup* const					blockGroup		= new TestCaseGroup(context, "patch_var_array", "Array types, per-patch");

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, arrayElem, blockGroup, true, 1);
		}
	}
	else if (lastStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}